

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.c++
# Opt level: O1

StringTree * __thiscall
capnp::anon_unknown_2::Indent::delimit
          (StringTree *__return_storage_ptr__,Indent *this,Array<kj::StringTree> *items,
          PrintMode mode,PrintKind kind)

{
  uint uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 __return_storage_ptr___00;
  size_t sVar5;
  Branch *pBVar6;
  char *pcVar7;
  size_t *psVar8;
  long lVar9;
  undefined4 in_register_00000084;
  FixedArray<char,_1UL> *params_2;
  StringTree *item;
  StringTree *this_00;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  StringPtr delim;
  StringPtr delim_00;
  Array<char> delimArrayPtr_heap;
  Array<kj::StringTree> *__range2;
  char flat [25];
  char delimArrayPtr_stack [32];
  undefined1 local_e1 [57];
  StringTree local_a8;
  StringTree local_68;
  
  params_2 = (FixedArray<char,_1UL> *)CONCAT44(in_register_00000084,kind);
  local_e1._5_4_ = kind;
  if (this->amount != 0) {
    bVar11 = items->size_ == 0;
    local_e1._1_4_ = mode;
    local_e1._33_8_ = items;
    local_e1._41_8_ = this;
    local_e1._49_8_ = __return_storage_ptr__;
    if (!bVar11) {
      this_00 = items->ptr;
      lVar9 = items->size_ * 0x38;
      bVar11 = false;
      uVar10 = 0;
      do {
        if (this_00->size_ < 0x19) {
          bVar12 = local_e1._5_4_ == RECORD;
          kj::StringTree::flattenTo(this_00,(char *)&local_a8);
          *(undefined1 *)((long)&local_a8.size_ + this_00->size_) = 0;
          pcVar7 = strchr((char *)&local_a8,10);
          bVar13 = pcVar7 == (char *)0x0;
          if (bVar13 && bVar12) {
            uVar10 = uVar10 + this_00->size_;
            bVar13 = uVar10 < 0x41;
          }
        }
        else {
          bVar13 = false;
        }
        if (!bVar13) break;
        this_00 = this_00 + 1;
        lVar9 = lVar9 + -0x38;
        bVar11 = lVar9 == 0;
      } while (!bVar11);
    }
    __return_storage_ptr___00 = local_e1._49_8_;
    uVar4 = local_e1._41_8_;
    uVar3 = local_e1._33_8_;
    uVar2 = local_e1._1_4_;
    items = (Array<kj::StringTree> *)local_e1._33_8_;
    __return_storage_ptr__ = (StringTree *)local_e1._49_8_;
    if (!bVar11) {
      uVar1 = *(uint *)local_e1._41_8_ * 2 + 3;
      if (uVar1 < 0x21) {
        local_e1._9_8_ = (size_t *)0x0;
        local_e1._17_8_ = 0;
        local_e1._25_8_ = (undefined8 *)0x0;
        psVar8 = &local_68.text.content.size_;
      }
      else {
        uVar10 = (ulong)uVar1;
        params_2 = (FixedArray<char,_1UL> *)0x0;
        psVar8 = (size_t *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (1,uVar10,uVar10,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
        local_e1._25_8_ = &kj::_::HeapArrayDisposer::instance;
        local_e1._9_8_ = psVar8;
        local_e1._17_8_ = uVar10;
      }
      *(undefined2 *)psVar8 = 0xa2c;
      memset((undefined2 *)((long)psVar8 + 2),0x20,(ulong)(*(uint *)uVar4 * 2));
      *(undefined1 *)((long)psVar8 + (ulong)(*(uint *)uVar4 * 2 + 2)) = 0;
      delim_00.content.size_._0_4_ = *(uint *)uVar4 * 2 + 3;
      delim_00.content.ptr = (char *)psVar8;
      delim_00.content.size_._4_4_ = 0;
      kj::StringTree::StringTree(&local_a8,(Array<kj::StringTree> *)uVar3,delim_00);
      local_68.size_ = (size_t)" ";
      if (uVar2 != BARE) {
        local_68.size_ = (size_t)((long)psVar8 + 1);
      }
      local_68.text.content.ptr = (char *)strlen((char *)local_68.size_);
      local_e1[0] = 0x20;
      kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::FixedArray<char,1ul>>
                ((StringTree *)__return_storage_ptr___00,&local_68,(ArrayPtr<const_char> *)&local_a8
                 ,(StringTree *)local_e1,params_2);
      sVar5 = local_a8.branches.size_;
      pBVar6 = local_a8.branches.ptr;
      if (local_a8.branches.ptr != (Branch *)0x0) {
        local_a8.branches.ptr = (Branch *)0x0;
        local_a8.branches.size_ = 0;
        (*(code *)**(undefined8 **)local_a8.branches.disposer)
                  (local_a8.branches.disposer,pBVar6,0x40,sVar5,sVar5,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      }
      sVar5 = local_a8.text.content.size_;
      pcVar7 = local_a8.text.content.ptr;
      if (local_a8.text.content.ptr != (char *)0x0) {
        local_a8.text.content.ptr = (char *)0x0;
        local_a8.text.content.size_ = 0;
        (*(code *)**(undefined8 **)local_a8.text.content.disposer)
                  (local_a8.text.content.disposer,pcVar7,1,sVar5,sVar5,0);
      }
      uVar4 = local_e1._17_8_;
      uVar3 = local_e1._9_8_;
      if ((size_t *)local_e1._9_8_ == (size_t *)0x0) {
        return (StringTree *)__return_storage_ptr___00;
      }
      local_e1._9_8_ = 0;
      local_e1._17_8_ = 0;
      (*(code *)**(undefined8 **)local_e1._25_8_)(local_e1._25_8_,uVar3,1,uVar4,uVar4,0);
      return (StringTree *)__return_storage_ptr___00;
    }
  }
  delim.content.size_ = 3;
  delim.content.ptr = ", ";
  kj::StringTree::StringTree(__return_storage_ptr__,items,delim);
  return __return_storage_ptr__;
}

Assistant:

kj::StringTree delimit(kj::Array<kj::StringTree> items, PrintMode mode, PrintKind kind) {
    if (amount == 0 || canPrintAllInline(items, kind)) {
      return kj::StringTree(kj::mv(items), ", ");
    } else {
      KJ_STACK_ARRAY(char, delimArrayPtr, amount * 2 + 3, 32, 256);
      auto delim = delimArrayPtr.begin();
      delim[0] = ',';
      delim[1] = '\n';
      memset(delim + 2, ' ', amount * 2);
      delim[amount * 2 + 2] = '\0';

      // If the outer value isn't being printed on its own line, we need to add a newline/indent
      // before the first item, otherwise we only add a space on the assumption that it is preceded
      // by an open bracket or parenthesis.
      return kj::strTree(mode == BARE ? " " : delim + 1,
          kj::StringTree(kj::mv(items), kj::StringPtr(delim, amount * 2 + 2)), ' ');
    }
  }